

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void output_ctable(void)

{
  uint local_24;
  int local_10;
  int local_c;
  int j;
  int i;
  
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"static ");
  }
  if (conflicts == (Yshort *)0x0) {
    local_24 = 0;
  }
  else {
    local_24 = *conflicts;
  }
  fprintf((FILE *)output_file,"int %sctable[] = {%39d,",symbol_prefix,(ulong)local_24);
  local_10 = 10;
  for (local_c = 1; local_c < nconflicts; local_c = local_c + 1) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)conflicts[local_c]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fprintf((FILE *)output_file,"\n};\n");
  if (conflicts != (Yshort *)0x0) {
    free(conflicts);
  }
  return;
}

Assistant:

void output_ctable()
{
    register int i;
    register int j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %sctable[] = {%39d,", symbol_prefix, conflicts ?
	    conflicts[0] : 0);

    j = 10;
    for (i = 1; i < nconflicts; i++)
    {
	if (j >= 10)
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}
	else
	    ++j;

	fprintf(output_file, "%5d,", conflicts[i]);
    }
    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (conflicts)
	FREE(conflicts);
}